

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsData.cpp
# Opt level: O1

int32_t helicsDataBufferFillFromBoolean(HelicsDataBuffer data,HelicsBool value)

{
  char *pcVar1;
  char *pcVar2;
  Message *pMVar3;
  char *in_RCX;
  int32_t iVar4;
  byte *size;
  string_view val;
  long *local_48;
  byte *local_40;
  long local_38 [2];
  
  if ((data == (HelicsDataBuffer)0x0) || (*(int *)((long)data + 0x5c) != 0x24ea663f)) {
    pMVar3 = getMessageObj(data,(HelicsError *)0x0);
    data = &pMVar3->data;
    if (pMVar3 == (Message *)0x0) {
      data = (SmallBuffer *)0x0;
    }
  }
  iVar4 = 0;
  if ((SmallBuffer *)data != (SmallBuffer *)0x0) {
    pcVar1 = "*1";
    if (value == 0) {
      pcVar1 = "+0";
    }
    pcVar2 = "*1";
    if (value == 0) {
      pcVar2 = "+0";
    }
    local_48 = local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,pcVar1 + 1,pcVar2 + 2);
    size = local_40 + 8;
    helics::SmallBuffer::reserve((SmallBuffer *)data,(size_t)size);
    ((SmallBuffer *)data)->bufferSize = (size_t)size;
    val._M_str = in_RCX;
    val._M_len = (size_t)local_48;
    helics::detail::convertToBinary((detail *)((SmallBuffer *)data)->heap,local_40,val);
    if (local_48 != local_38) {
      operator_delete(local_48,local_38[0] + 1);
    }
    iVar4 = (int32_t)((SmallBuffer *)data)->bufferSize;
  }
  return iVar4;
}

Assistant:

int32_t helicsDataBufferFillFromBoolean(HelicsDataBuffer data, HelicsBool value)
{
    auto* ptr = getBuffer(data);
    if (ptr == nullptr) {
        return 0;
    }
    const auto* dataValue = (value == HELICS_FALSE) ? "0" : "1";
    try {
        helics::ValueConverter<std::string>::convert(dataValue, *ptr);
        return static_cast<int32_t>(ptr->size());
    }
    catch (const std::bad_alloc&) {
        return 0;
    }
}